

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

int getDeviceType(uint devNumber)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  ostream *poVar3;
  uint uVar4;
  char *pcVar5;
  allocator local_3d;
  DWORD numDevs;
  string boardDescription;
  
  numDevs = 0;
  iVar2 = FT_CreateDeviceInfoList();
  if (iVar2 == 0) {
    if (devNumber < numDevs) {
      __ptr = malloc((ulong)numDevs * 0x68);
      iVar2 = FT_GetDeviceInfoList(__ptr,&numDevs);
      if (iVar2 == 0) {
        std::__cxx11::string::string
                  ((string *)&boardDescription,
                   (char *)((long)__ptr + (ulong)devNumber * 0x68 + 0x20),&local_3d);
        bVar1 = std::operator==(&boardDescription,"Alchitry Cu A");
        if (bVar1) {
          uVar4 = 2;
        }
        else {
          bVar1 = std::operator==(&boardDescription,"Alchitry Au A");
          uVar4 = 0;
          if (!bVar1) {
            bVar1 = std::operator==(&boardDescription,"Alchitry Au+ A");
            uVar4 = bVar1 - 1 | 1;
          }
        }
        std::__cxx11::string::~string((string *)&boardDescription);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error getting device list!");
        std::endl<char,std::char_traits<char>>(poVar3);
        uVar4 = 0xfffffffe;
      }
      free(__ptr);
      return uVar4;
    }
    pcVar5 = "Invalid device number!";
  }
  else {
    pcVar5 = "Could not read device list!";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return -2;
}

Assistant:

int getDeviceType(unsigned int devNumber) {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    int board = BOARD_ERROR;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return BOARD_ERROR;
    }

    if (numDevs <= devNumber) {
        cerr << "Invalid device number!" << endl;
        return BOARD_ERROR;
    }

    // allocate storage for list based on numDevs
    devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
            sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
    // get the device information list
    ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
    if (ftStatus == FT_OK) {
        string boardDescription = devInfo[devNumber].Description;
        if (boardDescription == "Alchitry Cu A") {
            board = BOARD_CU;
        } else if (boardDescription == "Alchitry Au A") {
            board = BOARD_AU;
        } else if (boardDescription == "Alchitry Au+ A") {
            board = BOARD_AU_PLUS;
        } else {
            board = BOARD_UNKNOWN;
        }
    } else {
        cerr << "Error getting device list!" << endl;
    }
    free(devInfo);

    return board;
}